

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu1_v2.c
# Opt level: O0

RK_U32 update_vepu1_syntax(HalH264eVepu1Ctx *ctx,MppSyntax *syntax)

{
  RK_U32 RVar1;
  int local_2c;
  uint local_28;
  RK_S32 i;
  RK_U32 updated;
  RK_S32 syn_num;
  H264eSyntaxDesc *desc;
  MppSyntax *syntax_local;
  HalH264eVepu1Ctx *ctx_local;
  
  _updated = (uint *)syntax->data;
  RVar1 = syntax->number;
  local_28 = 0;
  for (local_2c = 0; local_2c < (int)RVar1; local_2c = local_2c + 1) {
    switch(*_updated) {
    case 0:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update cfg","update_vepu1_syntax");
      }
      ctx->cfg = *(MppEncCfgSet **)(_updated + 2);
      break;
    case 1:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update sps","update_vepu1_syntax");
      }
      ctx->sps = *(H264eSps **)(_updated + 2);
      break;
    case 2:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update pps","update_vepu1_syntax");
      }
      ctx->pps = *(H264ePps **)(_updated + 2);
      break;
    case 3:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update dpb","update_vepu1_syntax");
      }
      break;
    case 4:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update slice","update_vepu1_syntax");
      }
      ctx->slice = *(H264eSlice **)(_updated + 2);
      break;
    case 5:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update frames","update_vepu1_syntax");
      }
      ctx->frms = *(H264eFrmInfo **)(_updated + 2);
      break;
    case 6:
      if ((hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu1_v2","update prefix nal","update_vepu1_syntax");
      }
      ctx->prefix = *(H264ePrefixNal **)(_updated + 2);
      break;
    default:
      _mpp_log_l(4,"hal_h264e_vepu1_v2","invalid syntax type %d\n","update_vepu1_syntax",
                 (ulong)*_updated);
    }
    local_28 = 1 << ((byte)*_updated & 0x1f) | local_28;
    _updated = _updated + 4;
  }
  return local_28;
}

Assistant:

static RK_U32 update_vepu1_syntax(HalH264eVepu1Ctx *ctx, MppSyntax *syntax)
{
    H264eSyntaxDesc *desc = syntax->data;
    RK_S32 syn_num = syntax->number;
    RK_U32 updated = 0;
    RK_S32 i;

    for (i = 0; i < syn_num; i++, desc++) {
        switch (desc->type) {
        case H264E_SYN_CFG : {
            hal_h264e_dbg_detail("update cfg");
            ctx->cfg = desc->p;
        } break;
        case H264E_SYN_SPS : {
            hal_h264e_dbg_detail("update sps");
            ctx->sps = desc->p;
        } break;
        case H264E_SYN_PPS : {
            hal_h264e_dbg_detail("update pps");
            ctx->pps = desc->p;
        } break;
        case H264E_SYN_DPB : {
            hal_h264e_dbg_detail("update dpb");
        } break;
        case H264E_SYN_SLICE : {
            hal_h264e_dbg_detail("update slice");
            ctx->slice = desc->p;
        } break;
        case H264E_SYN_FRAME : {
            hal_h264e_dbg_detail("update frames");
            ctx->frms = desc->p;
        } break;
        case H264E_SYN_PREFIX : {
            hal_h264e_dbg_detail("update prefix nal");
            ctx->prefix = desc->p;
        } break;
        default : {
            mpp_log_f("invalid syntax type %d\n", desc->type);
        } break;
        }

        updated |= SYN_TYPE_FLAG(desc->type);
    }

    return updated;
}